

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverseDependency
          (Node *this,uint64_t depId,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo,bool ignoreIfNotFound)

{
  iterator iVar1;
  Fault f;
  uint64_t depId_local;
  
  f.exception = (Exception *)depId;
  depId_local = depId;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->module->compiler->nodesById)._M_h,(key_type_conflict *)&f);
  if ((iVar1.
       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
       ._M_cur == (__node_type *)0x0) ||
     (*(Node **)((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                       ._M_cur + 0x10) == (Node *)0x0)) {
    if (!ignoreIfNotFound) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],unsigned_long&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                 ,0x34c,FAILED,(char *)0x0,"\"Dependency ID not present in compiler?\", depId",
                 (char (*) [39])"Dependency ID not present in compiler?",&depId_local);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else {
    traverse(*(Node **)((long)iVar1.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
                              ._M_cur + 0x10),eagerness,seen,finalLoader,sourceInfo);
  }
  return;
}

Assistant:

void Compiler::Node::traverseDependency(uint64_t depId, uint eagerness,
                                        std::unordered_map<Node*, uint>& seen,
                                        const SchemaLoader& finalLoader,
                                        kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo,
                                        bool ignoreIfNotFound) {
  KJ_IF_SOME(node, module->getCompiler().findNode(depId)) {
    node.traverse(eagerness, seen, finalLoader, sourceInfo);
  } else if (!ignoreIfNotFound) {
    KJ_FAIL_ASSERT("Dependency ID not present in compiler?", depId);
  }
}